

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O3

GLuint ShaderProgramCompile(string *src,GLenum type,string *error)

{
  char *pcVar1;
  GLuint GVar2;
  GLint length;
  GLint compile_status;
  GLchar *source;
  char info [8096];
  GLint local_1fd8;
  int local_1fd4;
  pointer local_1fd0;
  char local_1fc8 [8096];
  
  GVar2 = (*glad_glCreateShader)(type);
  local_1fd0 = (src->_M_dataplus)._M_p;
  (*glad_glShaderSource)(GVar2,1,&local_1fd0,(GLint *)0x0);
  (*glad_glCompileShader)(GVar2);
  (*glad_glGetShaderiv)(GVar2,0x8b81,&local_1fd4);
  if (local_1fd4 == 0) {
    local_1fd8 = 0;
    (*glad_glGetShaderiv)(GVar2,0x8b84,&local_1fd8);
    (*glad_glGetShaderInfoLog)(GVar2,local_1fd8,(GLsizei *)0x0,local_1fc8);
    pcVar1 = (char *)error->_M_string_length;
    strlen(local_1fc8);
    std::__cxx11::string::_M_replace((ulong)error,0,pcVar1,(ulong)local_1fc8);
    (*glad_glDeleteShader)(GVar2);
    GVar2 = 0;
  }
  return GVar2;
}

Assistant:

GLuint ShaderProgramCompile(const std::string src, GLenum type, std::string& error) {
    GLint compile_status;
    GLuint shader = glCreateShader(type);
    const GLchar* source = (const GLchar*) src.c_str();

    glShaderSource(shader, 1, &source, NULL);
    glCompileShader(shader);
    glGetShaderiv(shader, GL_COMPILE_STATUS, &compile_status);

    if (!compile_status) {
        GLint length = 0;
        glGetShaderiv(shader, GL_INFO_LOG_LENGTH, &length);
        
        char info[8096];
        glGetShaderInfoLog(shader, length, NULL, info);
        
        error = info;

        glDeleteShader(shader);
        return 0;
    }

    return shader;
}